

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htable.c
# Opt level: O2

HTABLE_NODE *
htable_lookup_internal
          (HTABLE *htable,uint32_t hash,HTABLE_NODE *key,HTABLE_NODE ***p_ref,
          HTABLE_CMP_FUNC cmp_func)

{
  HTABLE_NODE *pHVar1;
  int iVar2;
  HTABLE_NODE *pHVar3;
  uint uVar4;
  
  uVar4 = htable->n_planes;
  do {
    if ((int)uVar4 < 1) {
      return (HTABLE_NODE *)0x0;
    }
    uVar4 = uVar4 - 1;
    pHVar1 = (HTABLE_NODE *)
             (((ulong)hash % (ulong)(uint)(0x3b << ((byte)uVar4 & 0x1f))) * 8 +
             (long)htable->planes[uVar4]);
    while (pHVar3 = pHVar1, pHVar1 = pHVar3->next, pHVar1 != (HTABLE_NODE *)0x0) {
      iVar2 = (*cmp_func)(key,pHVar1);
      if (iVar2 == 0) {
        if (p_ref == (HTABLE_NODE ***)0x0) {
          return pHVar1;
        }
        *p_ref = &pHVar3->next;
        return pHVar1;
      }
    }
  } while( true );
}

Assistant:

static HTABLE_NODE*
htable_lookup_internal(HTABLE* htable, uint32_t hash, const HTABLE_NODE* key,
                       HTABLE_NODE*** p_ref, HTABLE_CMP_FUNC cmp_func)
{
    HTABLE_NODE* node;
    HTABLE_NODE** ref;
    int i;

    /* It's better to lookup the biggest planes first, as much more stuff is
     * stored there, and also because it's moire recently inserted stuff which
     * is arguably more likely to accessed soon. */
    for(i = htable->n_planes-1; i >= 0; i--) {
        HTABLE_NODE** plane;
        size_t index;

        plane = (HTABLE_NODE**) htable->planes[i];
        index = hash % HTABLE_PLANE_SIZE(i);

        ref = &plane[index];
        node = plane[index];

        while(node != NULL) {
            if(cmp_func(key, node) == 0) {
                if(p_ref != NULL)
                    *p_ref = ref;
                return node;
            }

            ref = &node->next;
            node = node->next;
        }
    }

    return NULL;
}